

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QFileDialogPrivate::HistoryItem>::data(QList<QFileDialogPrivate::HistoryItem> *this)

{
  QArrayDataPointer<QFileDialogPrivate::HistoryItem> *this_00;
  HistoryItem *pHVar1;
  QArrayDataPointer<QFileDialogPrivate::HistoryItem> *in_RDI;
  
  detach((QList<QFileDialogPrivate::HistoryItem> *)0x77df9c);
  this_00 = (QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)
            QArrayDataPointer<QFileDialogPrivate::HistoryItem>::operator->(in_RDI);
  pHVar1 = QArrayDataPointer<QFileDialogPrivate::HistoryItem>::data(this_00);
  return pHVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }